

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool __thiscall
icu_63::FCDUTF16CollationIterator::previousSegment
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  UChar *p;
  UChar *local_30;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  local_30 = (this->super_UTF16CollationIterator).pos;
  pUVar5 = this->rawStart;
  uVar4 = 0;
  do {
    pUVar6 = local_30;
    uVar2 = Normalizer2Impl::previousFCD16(this->nfcImpl,pUVar5,&local_30);
    uVar3 = uVar2 & 0xff;
    if ((uVar3 == 0) && (pUVar6 != (this->super_UTF16CollationIterator).pos)) break;
    if ((uVar3 != 0) &&
       ((((char)uVar4 != '\0' && uVar4 < uVar3 || (uVar2 == 0x8184)) || (uVar2 == 0x8182)))) {
      goto LAB_00235850;
    }
    pUVar6 = local_30;
    if (uVar2 < 0x100) break;
    uVar4 = uVar2 >> 8;
    pUVar5 = this->rawStart;
  } while (local_30 != pUVar5);
  this->segmentStart = pUVar6;
  (this->super_UTF16CollationIterator).start = pUVar6;
  goto LAB_002358a2;
  while (uVar2 = Normalizer2Impl::previousFCD16(this->nfcImpl,this->rawStart,&local_30), uVar2 != 0)
  {
LAB_00235850:
    pUVar5 = local_30;
    if ((uVar2 < 0x100) || (local_30 == this->rawStart)) break;
  }
  UVar1 = normalize(this,pUVar5,(this->super_UTF16CollationIterator).pos,errorCode);
  if (UVar1 == '\0') {
    return '\0';
  }
  (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).limit;
LAB_002358a2:
  this->checkDir = '\0';
  return '\x01';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }